

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O0

void UnitTest::
     ExecuteTest<SuiteSessionTests::initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper>
               (initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
                *testObject,TestDetails *details)

{
  int iVar1;
  TestDetails **ppTVar2;
  undefined8 *puVar3;
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_478 [8];
  SignalTranslator sig;
  TestDetails *details_local;
  initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
  *testObject_local;
  
  sig.m_old_SIGALRM_action.sa_restorer = (_func_void *)details;
  ppTVar2 = CurrentTest::Details();
  *ppTVar2 = details;
  SignalTranslator::SignalTranslator((SignalTranslator *)local_478);
  iVar1 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar1 != 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "Unhandled system exception";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  SuiteSessionTests::
  initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
  ::RunImpl(testObject);
  SignalTranslator::~SignalTranslator((SignalTranslator *)local_478);
  return;
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}